

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O3

bool __thiscall FpgaIO::ReadFirewirePhy(FpgaIO *this,uchar addr,uchar *data)

{
  BasePort *pBVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  char *pcVar5;
  ostream *poVar6;
  quadlet_t read_data;
  uint local_1c;
  
  uVar4 = CONCAT71(in_register_00000031,addr) & 0xffffffff;
  if ((byte)uVar4 < 0x10) {
    local_1c = 0;
    pBVar1 = (this->super_BoardIO).port;
    iVar2 = (*pBVar1->_vptr_BasePort[0x24])(pBVar1,(ulong)(this->super_BoardIO).BoardId,1,uVar4);
    if ((char)iVar2 == '\0') {
      return false;
    }
    pBVar1 = (this->super_BoardIO).port;
    iVar2 = (*pBVar1->_vptr_BasePort[0x23])(pBVar1,(ulong)(this->super_BoardIO).BoardId,2,&local_1c)
    ;
    if ((char)iVar2 == '\0') {
      return false;
    }
    if ((local_1c >> 8 & 0xf) == (uint)CONCAT71(in_register_00000031,addr)) {
      *data = (uchar)local_1c;
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ReadFirewirePhy: read addr ",0x1b);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    pcVar5 = ", expected ";
    lVar3 = 0xb;
  }
  else {
    poVar6 = (ostream *)&std::cout;
    pcVar5 = "ReadFirewirePhy: invalid addr ";
    lVar3 = 0x1e;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar5,lVar3);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return false;
}

Assistant:

bool FpgaIO::ReadFirewirePhy(unsigned char addr, unsigned char &data)
{
    if (addr > 15) {
        std::cout << "ReadFirewirePhy: invalid addr "
                  << static_cast<unsigned int>(addr) << std::endl;
        return false;
    }
    quadlet_t write_data = addr;
    quadlet_t read_data = 0;
    if (!port->WriteQuadlet(BoardId, BoardIO::FW_PHY_REQ, write_data))
        return false;
    if (!port->ReadQuadlet(BoardId, BoardIO::FW_PHY_RESP, read_data))
        return false;
    // Register address in read response is bits 11-8
    unsigned char read_addr = static_cast<unsigned char>(read_data>>8) & 0x0f;
    // Check that it matches the request address
    if (read_addr != addr) {
        std::cout << "ReadFirewirePhy: read addr " << static_cast<unsigned int>(read_addr)
                  << ", expected " << static_cast<unsigned int>(addr) << std::endl;
        return false;
    }
    data = static_cast<unsigned char>(read_data);
    return true;
}